

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

string * __thiscall
jsonnet::internal::uop_string_abi_cxx11_(string *__return_storage_ptr__,internal *this,UnaryOp uop)

{
  ostream *poVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "!";
    __a = &local_14;
    break;
  case 1:
    __s = "~";
    __a = &local_13;
    break;
  case 2:
    __s = "+";
    __a = &local_11;
    break;
  case 3:
    __s = "-";
    __a = &local_12;
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unrecognised unary operator: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)this);
    std::endl<char,std::char_traits<char>>(poVar1);
    abort();
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string uop_string(UnaryOp uop)
{
    switch (uop) {
        case UOP_PLUS: return "+";
        case UOP_MINUS: return "-";
        case UOP_BITWISE_NOT: return "~";
        case UOP_NOT: return "!";

        default:
            std::cerr << "INTERNAL ERROR: Unrecognised unary operator: " << uop << std::endl;
            std::abort();
    }
}